

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

bool slang::syntax::SyntaxFacts::isPossiblePropertyPortItem(TokenKind kind)

{
  int iVar1;
  bool bVar2;
  undefined6 in_register_0000003a;
  
  iVar1 = (int)CONCAT62(in_register_0000003a,kind);
  if ((((0x3f < iVar1 - 0xc1U) ||
       ((0x8000804000010003U >> ((ulong)(iVar1 - 0xc1U) & 0x3f) & 1) == 0)) && (iVar1 != 0x11)) &&
     ((iVar1 != 0x18 && (iVar1 != 0x112)))) {
    bVar2 = isPossibleDataType(kind);
    return bVar2;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isPossiblePropertyPortItem(TokenKind kind) {
    switch (kind) {
        case TokenKind::OpenParenthesis:
        case TokenKind::LocalKeyword:
        case TokenKind::PropertyKeyword:
        case TokenKind::SequenceKeyword:
        case TokenKind::Comma:
        case TokenKind::InputKeyword:
        case TokenKind::OutputKeyword:
        case TokenKind::InOutKeyword:
        case TokenKind::RefKeyword:
            return true;
        default:
            return isPossibleDataType(kind);
    }
}